

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

void duckdb::QuantileListOperation<duckdb::interval_t,true>::
     Window<duckdb::QuantileState<duckdb::interval_t,duckdb::QuantileStandardType>,duckdb::interval_t,duckdb::list_entry_t>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *list,idx_t lidx
               )

{
  bool bVar1;
  TemplatedValidityMask<unsigned_long> *this;
  ValidityMask *row_idx;
  WindowQuantileState<duckdb::interval_t> *this_00;
  Vector *in_RCX;
  idx_t in_RDX;
  SubFrames *in_RSI;
  CursorType *in_RDI;
  idx_t in_R8;
  QuantileIncluded<duckdb::interval_t> *in_R9;
  WindowQuantileState<duckdb::interval_t> *unaff_retaddr;
  WindowQuantileState<duckdb::interval_t> *window_state;
  ValidityMask *lmask;
  idx_t n;
  QuantileIncluded<duckdb::interval_t> included;
  QuantileBindData *bind_data;
  ValidityMask *fmask;
  CursorType *data;
  QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType> *gstate;
  QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType> *state;
  QuantileBindData *pQVar2;
  QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType> *in_stack_ffffffffffffff80;
  WindowPartitionInput *in_stack_ffffffffffffff88;
  QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType> *in_stack_ffffffffffffff90;
  QuantileIncluded<duckdb::interval_t> local_68;
  QuantileBindData *local_58;
  pointer local_50;
  CursorType *local_48;
  idx_t local_40;
  Vector *list_00;
  
  local_40 = in_RDX;
  list_00 = in_RCX;
  local_48 = QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType>::
             GetOrCreateWindowCursor(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_50 = in_RSI[3].super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
             super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  optional_ptr<duckdb::FunctionData,_true>::operator->
            ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffff80);
  local_58 = FunctionData::Cast<duckdb::QuantileBindData>((FunctionData *)in_stack_ffffffffffffff80)
  ;
  QuantileIncluded<duckdb::interval_t>::QuantileIncluded
            (&local_68,(ValidityMask *)local_50,local_48);
  this = (TemplatedValidityMask<unsigned_long> *)
         QuantileOperation::FrameSize<duckdb::interval_t>(in_R9,(SubFrames *)in_RCX);
  if (this == (TemplatedValidityMask<unsigned_long> *)0x0) {
    row_idx = FlatVector::Validity((Vector *)0xa63ada);
    TemplatedValidityMask<unsigned_long>::Set
              (this,(idx_t)row_idx,SUB81((ulong)in_stack_ffffffffffffff80 >> 0x38,0));
  }
  else if ((local_40 == 0) ||
          (bVar1 = QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType>::HasTree
                             (in_stack_ffffffffffffff80), !bVar1)) {
    this_00 = QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType>::
              GetOrCreateWindowState(in_stack_ffffffffffffff80);
    WindowQuantileState<duckdb::interval_t>::UpdateSkip
              ((WindowQuantileState<duckdb::interval_t> *)lmask,(CursorType *)window_state,
               (SubFrames *)unaff_retaddr,(IncludedType *)in_RDI);
    pQVar2 = local_58;
    WindowQuantileState<duckdb::interval_t>::WindowList<duckdb::interval_t,true>
              (unaff_retaddr,in_RDI,in_RSI,in_RDX,list_00,in_R8,(QuantileBindData *)lmask);
    vector<duckdb::FrameBounds,_true>::operator=
              ((vector<duckdb::FrameBounds,_true> *)this_00,
               (vector<duckdb::FrameBounds,_true> *)pQVar2);
  }
  else {
    QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType>::GetWindowState
              ((QuantileState<duckdb::interval_t,_duckdb::QuantileStandardType> *)0xa63b1a);
    WindowQuantileState<duckdb::interval_t>::WindowList<duckdb::interval_t,true>
              (unaff_retaddr,in_RDI,in_RSI,in_RDX,list_00,in_R8,(QuantileBindData *)lmask);
  }
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &list,
	                   idx_t lidx) {
		auto &state = *reinterpret_cast<STATE *>(l_state);
		auto gstate = reinterpret_cast<const STATE *>(g_state);

		auto &data = state.GetOrCreateWindowCursor(partition);
		const auto &fmask = partition.filter_mask;

		D_ASSERT(aggr_input_data.bind_data);
		auto &bind_data = aggr_input_data.bind_data->Cast<QuantileBindData>();

		QuantileIncluded<INPUT_TYPE> included(fmask, data);
		const auto n = FrameSize(included, frames);

		// Result is a constant LIST<RESULT_TYPE> with a fixed length
		if (!n) {
			auto &lmask = FlatVector::Validity(list);
			lmask.Set(lidx, false);
			return;
		}

		if (gstate && gstate->HasTree()) {
			gstate->GetWindowState().template WindowList<CHILD_TYPE, DISCRETE>(data, frames, n, list, lidx, bind_data);
		} else {
			auto &window_state = state.GetOrCreateWindowState();
			window_state.UpdateSkip(data, frames, included);
			window_state.template WindowList<CHILD_TYPE, DISCRETE>(data, frames, n, list, lidx, bind_data);
			window_state.prevs = frames;
		}
	}